

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterHandle::mousePressEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  Representation RVar2;
  QPoint QVar3;
  long in_FS_OFFSET;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) == 1) {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar3 = QPointF::toPoint(&local_28);
    RVar2 = QVar3.yp.m_i;
    if (*(int *)(lVar1 + 0x260) == 1) {
      RVar2 = QVar3.xp.m_i;
    }
    *(int *)(lVar1 + 0x264) = RVar2.m_i;
    *(byte *)(lVar1 + 0x268) = *(byte *)(lVar1 + 0x268) | 4;
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::mousePressEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (e->button() == Qt::LeftButton) {
        d->mouseOffset = d->pick(e->position().toPoint());
        d->pressed = true;
        update();
    }
}